

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decodeLiteralsBlock
                 (ZSTD_DCtx *dctx,void *src,size_t srcSize,void *dst,size_t dstCapacity,
                 streaming_operation streaming)

{
  byte bVar1;
  U16 UVar2;
  uint uVar3;
  U32 UVar4;
  int iVar5;
  uint flags_00;
  bool bVar6;
  ulong local_118;
  ulong local_108;
  ulong local_f8;
  size_t expectedWriteSize_2;
  size_t lhSize_2;
  size_t litSize_2;
  U32 lhlCode_2;
  size_t expectedWriteSize_1;
  long lStack_b8;
  U32 lhlCode_1;
  size_t lhSize_1;
  size_t litSize_1;
  size_t _pos;
  size_t _size;
  char *_ptr;
  int flags;
  size_t expectedWriteSize;
  size_t hufSuccess;
  U32 lhc;
  U32 lhlCode;
  U32 singleStream;
  size_t litCSize;
  size_t litSize;
  size_t lhSize;
  symbolEncodingType_e litEncType;
  BYTE *istart;
  streaming_operation streaming_local;
  size_t dstCapacity_local;
  void *dst_local;
  size_t srcSize_local;
  void *src_local;
  ZSTD_DCtx *dctx_local;
  
  if (srcSize < 2) {
    return 0xffffffffffffffec;
  }
  bVar1 = *src & 3;
  switch(bVar1) {
  case 0:
    local_108 = dstCapacity;
    if (0x20000 < dstCapacity) {
      local_108 = 0x20000;
    }
    switch((int)(uint)*src >> 2 & 3) {
    case 0:
    case 2:
    default:
      lStack_b8 = 1;
      lhSize_1 = (size_t)((int)(uint)*src >> 3);
      break;
    case 1:
      lStack_b8 = 2;
      UVar2 = MEM_readLE16(src);
      lhSize_1 = (size_t)((int)(uint)UVar2 >> 4);
      break;
    case 3:
      lStack_b8 = 3;
      if (srcSize < 3) {
        return 0xffffffffffffffec;
      }
      UVar4 = MEM_readLE24(src);
      lhSize_1 = (size_t)(UVar4 >> 4);
    }
    if ((lhSize_1 != 0) && (dst == (void *)0x0)) {
      return 0xffffffffffffffba;
    }
    if (local_108 < lhSize_1) {
      return 0xffffffffffffffba;
    }
    ZSTD_allocateLiteralsBuffer(dctx,dst,dstCapacity,lhSize_1,streaming,local_108,1);
    if (srcSize < lStack_b8 + lhSize_1 + 0x20) {
      if (srcSize < lhSize_1 + lStack_b8) {
        return 0xffffffffffffffec;
      }
      if (dctx->litBufferLocation == ZSTD_split) {
        memcpy(dctx->litBuffer,(void *)((long)src + lStack_b8),lhSize_1 - 0x10000);
        memcpy(dctx->litExtraBuffer,(void *)((long)src + lhSize_1 + lStack_b8 + -0x10000),0x10000);
      }
      else {
        memcpy(dctx->litBuffer,(void *)((long)src + lStack_b8),lhSize_1);
      }
      dctx->litPtr = dctx->litBuffer;
      dctx->litSize = lhSize_1;
      return lStack_b8 + lhSize_1;
    }
    dctx->litPtr = (BYTE *)((long)src + lStack_b8);
    dctx->litSize = lhSize_1;
    dctx->litBufferEnd = dctx->litPtr + lhSize_1;
    dctx->litBufferLocation = ZSTD_not_in_dst;
    return lStack_b8 + lhSize_1;
  case 1:
    local_118 = dstCapacity;
    if (0x20000 < dstCapacity) {
      local_118 = 0x20000;
    }
    switch((int)(uint)*src >> 2 & 3) {
    case 0:
    case 2:
    default:
      expectedWriteSize_2 = 1;
      lhSize_2 = (size_t)((int)(uint)*src >> 3);
      break;
    case 1:
      expectedWriteSize_2 = 2;
      if (srcSize < 3) {
        return 0xffffffffffffffec;
      }
      UVar2 = MEM_readLE16(src);
      lhSize_2 = (size_t)((int)(uint)UVar2 >> 4);
      break;
    case 3:
      expectedWriteSize_2 = 3;
      if (srcSize < 4) {
        return 0xffffffffffffffec;
      }
      UVar4 = MEM_readLE24(src);
      lhSize_2 = (size_t)(UVar4 >> 4);
    }
    if ((lhSize_2 != 0) && (dst == (void *)0x0)) {
      return 0xffffffffffffffba;
    }
    if (0x20000 < lhSize_2) {
      return 0xffffffffffffffec;
    }
    if (local_118 < lhSize_2) {
      return 0xffffffffffffffba;
    }
    ZSTD_allocateLiteralsBuffer(dctx,dst,dstCapacity,lhSize_2,streaming,local_118,1);
    if (dctx->litBufferLocation == ZSTD_split) {
      memset(dctx->litBuffer,(uint)*(byte *)((long)src + expectedWriteSize_2),lhSize_2 - 0x10000);
      memset(dctx->litExtraBuffer,(uint)*(byte *)((long)src + expectedWriteSize_2),0x10000);
    }
    else {
      memset(dctx->litBuffer,(uint)*(byte *)((long)src + expectedWriteSize_2),lhSize_2);
    }
    dctx->litPtr = dctx->litBuffer;
    dctx->litSize = lhSize_2;
    return expectedWriteSize_2 + 1;
  case 2:
    goto switchD_004314c5_caseD_2;
  case 3:
    break;
  default:
    return 0xffffffffffffffec;
  }
  if (dctx->litEntropy == 0) {
    return 0xffffffffffffffe2;
  }
switchD_004314c5_caseD_2:
  if (srcSize < 5) {
    return 0xffffffffffffffec;
  }
  bVar6 = false;
  uVar3 = (int)(uint)*src >> 2 & 3;
  UVar4 = MEM_readLE32(src);
  local_f8 = dstCapacity;
  if (0x20000 < dstCapacity) {
    local_f8 = 0x20000;
  }
  iVar5 = ZSTD_DCtx_get_bmi2(dctx);
  flags_00 = (uint)(iVar5 != 0) | (uint)(dctx->disableHufAsm != 0) << 4;
  if (1 < uVar3) {
    if (uVar3 == 2) {
      litSize = 4;
      litCSize = (size_t)(UVar4 >> 4 & 0x3fff);
      _lhlCode = (ulong)(UVar4 >> 0x12);
      goto LAB_0043163b;
    }
    if (uVar3 == 3) {
      litSize = 5;
      litCSize = (size_t)(UVar4 >> 4 & 0x3ffff);
      _lhlCode = (ulong)(UVar4 >> 0x16) + (ulong)*(byte *)((long)src + 4) * 0x400;
      goto LAB_0043163b;
    }
  }
  bVar6 = uVar3 == 0;
  litSize = 3;
  litCSize = (size_t)(UVar4 >> 4 & 0x3ff);
  _lhlCode = (ulong)(UVar4 >> 0xe & 0x3ff);
LAB_0043163b:
  if ((litCSize == 0) || (dst != (void *)0x0)) {
    if (litCSize < 0x20001) {
      if ((bVar6) || (5 < litCSize)) {
        if (srcSize < _lhlCode + litSize) {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
        }
        else if (local_f8 < litCSize) {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffba;
        }
        else {
          ZSTD_allocateLiteralsBuffer(dctx,dst,dstCapacity,litCSize,streaming,local_f8,0);
          if ((dctx->ddictIsCold != 0) && (0x300 < litCSize)) {
            for (litSize_1 = 0; litSize_1 < 0x4004; litSize_1 = litSize_1 + 0x40) {
            }
          }
          if (bVar1 == 3) {
            if (bVar6) {
              expectedWriteSize =
                   HUF_decompress1X_usingDTable
                             (dctx->litBuffer,litCSize,(void *)((long)src + litSize),_lhlCode,
                              dctx->HUFptr,flags_00);
            }
            else {
              if (litCSize < 6) {
                __assert_fail("litSize >= MIN_LITERALS_FOR_4_STREAMS",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0xbe,
                              "size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx *, const void *, size_t, void *, size_t, const streaming_operation)"
                             );
              }
              expectedWriteSize =
                   HUF_decompress4X_usingDTable
                             (dctx->litBuffer,litCSize,(void *)((long)src + litSize),_lhlCode,
                              dctx->HUFptr,flags_00);
            }
          }
          else if (bVar6) {
            expectedWriteSize =
                 HUF_decompress1X1_DCtx_wksp
                           ((dctx->entropy).hufTable,dctx->litBuffer,litCSize,
                            (void *)((long)src + litSize),_lhlCode,dctx->workspace,0xa00,flags_00);
          }
          else {
            expectedWriteSize =
                 HUF_decompress4X_hufOnly_wksp
                           ((dctx->entropy).hufTable,dctx->litBuffer,litCSize,
                            (void *)((long)src + litSize),_lhlCode,dctx->workspace,0xa00,flags_00);
          }
          if (dctx->litBufferLocation == ZSTD_split) {
            memcpy(dctx->litExtraBuffer,dctx->litBufferEnd + -0x10000,0x10000);
            memmove(dctx->litBuffer + 0xffe0,dctx->litBuffer,litCSize - 0x10000);
            dctx->litBuffer = dctx->litBuffer + 0xffe0;
            dctx->litBufferEnd = dctx->litBufferEnd + -0x20;
          }
          uVar3 = ERR_isError(expectedWriteSize);
          if (uVar3 == 0) {
            dctx->litPtr = dctx->litBuffer;
            dctx->litSize = litCSize;
            dctx->litEntropy = 1;
            if (bVar1 == 2) {
              dctx->HUFptr = (dctx->entropy).hufTable;
            }
            dctx_local = (ZSTD_DCtx *)(_lhlCode + litSize);
          }
          else {
            dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
          }
        }
      }
      else {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffe8;
      }
    }
    else {
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
    }
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffba;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx* dctx,
                          const void* src, size_t srcSize,   /* note : srcSize < BLOCKSIZE */
                          void* dst, size_t dstCapacity, const streaming_operation streaming)
{
    DEBUGLOG(5, "ZSTD_decodeLiteralsBlock");
    RETURN_ERROR_IF(srcSize < MIN_CBLOCK_SIZE, corruption_detected, "");

    {   const BYTE* const istart = (const BYTE*) src;
        symbolEncodingType_e const litEncType = (symbolEncodingType_e)(istart[0] & 3);

        switch(litEncType)
        {
        case set_repeat:
            DEBUGLOG(5, "set_repeat flag : re-using stats from previous compressed literals block");
            RETURN_ERROR_IF(dctx->litEntropy==0, dictionary_corrupted, "");
            ZSTD_FALLTHROUGH;

        case set_compressed:
            RETURN_ERROR_IF(srcSize < 5, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need up to 5 for case 3");
            {   size_t lhSize, litSize, litCSize;
                U32 singleStream=0;
                U32 const lhlCode = (istart[0] >> 2) & 3;
                U32 const lhc = MEM_readLE32(istart);
                size_t hufSuccess;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                int const flags = 0
                    | (ZSTD_DCtx_get_bmi2(dctx) ? HUF_flags_bmi2 : 0)
                    | (dctx->disableHufAsm ? HUF_flags_disableAsm : 0);
                switch(lhlCode)
                {
                case 0: case 1: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    /* 2 - 2 - 10 - 10 */
                    singleStream = !lhlCode;
                    lhSize = 3;
                    litSize  = (lhc >> 4) & 0x3FF;
                    litCSize = (lhc >> 14) & 0x3FF;
                    break;
                case 2:
                    /* 2 - 2 - 14 - 14 */
                    lhSize = 4;
                    litSize  = (lhc >> 4) & 0x3FFF;
                    litCSize = lhc >> 18;
                    break;
                case 3:
                    /* 2 - 2 - 18 - 18 */
                    lhSize = 5;
                    litSize  = (lhc >> 4) & 0x3FFFF;
                    litCSize = (lhc >> 22) + ((size_t)istart[4] << 10);
                    break;
                }
                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected, "");
                if (!singleStream)
                    RETURN_ERROR_IF(litSize < MIN_LITERALS_FOR_4_STREAMS, literals_headerWrong,
                        "Not enough literals (%zu) for the 4-streams mode (min %u)",
                        litSize, MIN_LITERALS_FOR_4_STREAMS);
                RETURN_ERROR_IF(litCSize + lhSize > srcSize, corruption_detected, "");
                RETURN_ERROR_IF(expectedWriteSize < litSize , dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 0);

                /* prefetch huffman table if cold */
                if (dctx->ddictIsCold && (litSize > 768 /* heuristic */)) {
                    PREFETCH_AREA(dctx->HUFptr, sizeof(dctx->entropy.hufTable));
                }

                if (litEncType==set_repeat) {
                    if (singleStream) {
                        hufSuccess = HUF_decompress1X_usingDTable(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, flags);
                    } else {
                        assert(litSize >= MIN_LITERALS_FOR_4_STREAMS);
                        hufSuccess = HUF_decompress4X_usingDTable(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, flags);
                    }
                } else {
                    if (singleStream) {
#if defined(HUF_FORCE_DECOMPRESS_X2)
                        hufSuccess = HUF_decompress1X_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
#else
                        hufSuccess = HUF_decompress1X1_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
#endif
                    } else {
                        hufSuccess = HUF_decompress4X_hufOnly_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
                    }
                }
                if (dctx->litBufferLocation == ZSTD_split)
                {
                    ZSTD_memcpy(dctx->litExtraBuffer, dctx->litBufferEnd - ZSTD_LITBUFFEREXTRASIZE, ZSTD_LITBUFFEREXTRASIZE);
                    ZSTD_memmove(dctx->litBuffer + ZSTD_LITBUFFEREXTRASIZE - WILDCOPY_OVERLENGTH, dctx->litBuffer, litSize - ZSTD_LITBUFFEREXTRASIZE);
                    dctx->litBuffer += ZSTD_LITBUFFEREXTRASIZE - WILDCOPY_OVERLENGTH;
                    dctx->litBufferEnd -= WILDCOPY_OVERLENGTH;
                }

                RETURN_ERROR_IF(HUF_isError(hufSuccess), corruption_detected, "");

                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                dctx->litEntropy = 1;
                if (litEncType==set_compressed) dctx->HUFptr = dctx->entropy.hufTable;
                return litCSize + lhSize;
            }

        case set_basic:
            {   size_t litSize, lhSize;
                U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    RETURN_ERROR_IF(srcSize<3, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize = 3");
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }

                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(expectedWriteSize < litSize, dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 1);
                if (lhSize+litSize+WILDCOPY_OVERLENGTH > srcSize) {  /* risk reading beyond src buffer with wildcopy */
                    RETURN_ERROR_IF(litSize+lhSize > srcSize, corruption_detected, "");
                    if (dctx->litBufferLocation == ZSTD_split)
                    {
                        ZSTD_memcpy(dctx->litBuffer, istart + lhSize, litSize - ZSTD_LITBUFFEREXTRASIZE);
                        ZSTD_memcpy(dctx->litExtraBuffer, istart + lhSize + litSize - ZSTD_LITBUFFEREXTRASIZE, ZSTD_LITBUFFEREXTRASIZE);
                    }
                    else
                    {
                        ZSTD_memcpy(dctx->litBuffer, istart + lhSize, litSize);
                    }
                    dctx->litPtr = dctx->litBuffer;
                    dctx->litSize = litSize;
                    return lhSize+litSize;
                }
                /* direct reference into compressed stream */
                dctx->litPtr = istart+lhSize;
                dctx->litSize = litSize;
                dctx->litBufferEnd = dctx->litPtr + litSize;
                dctx->litBufferLocation = ZSTD_not_in_dst;
                return lhSize+litSize;
            }

        case set_rle:
            {   U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t litSize, lhSize;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    RETURN_ERROR_IF(srcSize<3, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize+1 = 3");
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    RETURN_ERROR_IF(srcSize<4, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize+1 = 4");
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }
                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected, "");
                RETURN_ERROR_IF(expectedWriteSize < litSize, dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 1);
                if (dctx->litBufferLocation == ZSTD_split)
                {
                    ZSTD_memset(dctx->litBuffer, istart[lhSize], litSize - ZSTD_LITBUFFEREXTRASIZE);
                    ZSTD_memset(dctx->litExtraBuffer, istart[lhSize], ZSTD_LITBUFFEREXTRASIZE);
                }
                else
                {
                    ZSTD_memset(dctx->litBuffer, istart[lhSize], litSize);
                }
                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                return lhSize+1;
            }
        default:
            RETURN_ERROR(corruption_detected, "impossible");
        }
    }
}